

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O1

int hungarian_algorithm::
    solve<int,unsigned_long,boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<int>>
              (matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
               *cost_function,unsigned_long num_rows,unsigned_long num_cols,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map,
              less<int> *cost_comparator,int *zero_cost)

{
  int iVar1;
  HungarianSolver<int,_unsigned_long,_std::less<int>_> solver;
  HungarianSolver<int,_unsigned_long,_std::less<int>_> HStack_118;
  
  HungarianSolver<int,_unsigned_long,_std::less<int>_>::HungarianSolver
            (&HStack_118,num_rows,num_cols,cost_comparator,zero_cost);
  HungarianSolver<int,unsigned_long,std::less<int>>::
  solve<boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>>
            ((HungarianSolver<int,unsigned_long,std::less<int>> *)&HStack_118,cost_function);
  iVar1 = HungarianSolver<int,unsigned_long,std::less<int>>::
          getAssignment<boost::numeric::ublas::matrix<int,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<int,std::allocator<int>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    ((HungarianSolver<int,unsigned_long,std::less<int>> *)&HStack_118,cost_function,
                     assignment_map);
  if (HStack_118.cost_matrix_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(HStack_118.cost_matrix_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HungarianSolverBase::~HungarianSolverBase(&HStack_118.super_HungarianSolverBase);
  return iVar1;
}

Assistant:

Cost solve(const CostFunction& cost_function, const Size num_rows, const Size num_cols, AssignmentMap& assignment_map,
           const CostComparator& cost_comparator, const Cost& zero_cost)
{
  HungarianSolver<Cost, Size, CostComparator> solver(num_rows, num_cols, cost_comparator, zero_cost);
  solver.solve(cost_function);
  return solver.getAssignment(cost_function, assignment_map);
}